

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *this;
  string *psVar4;
  reference ppcVar5;
  ostream *poVar6;
  char *pcVar7;
  byte local_76b;
  byte local_76a;
  string local_758;
  string local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string local_6f8 [32];
  undefined1 local_6d8 [8];
  ostringstream e_2;
  string local_560;
  pair<bool,_bool> local_53a;
  string local_538 [6];
  pair<bool,_bool> consistent_2;
  undefined1 local_518 [8];
  ostringstream e_1;
  string local_3a0;
  pair<bool,_bool> local_37a;
  string local_378 [6];
  pair<bool,_bool> consistent_1;
  undefined1 local_358 [8];
  ostringstream e;
  string local_1e0;
  pair<bool,_bool> local_1ba;
  undefined1 local_1b8 [6];
  pair<bool,_bool> consistent;
  undefined1 local_198 [8];
  string reportEntry;
  iterator iStack_170;
  bool ifacePropContent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  byte local_149;
  undefined1 local_148 [7];
  bool ifaceIsSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  cmGeneratorTarget *theTarget;
  __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
  local_120;
  const_iterator li;
  string interfaceProperty;
  allocator local_d1;
  undefined1 local_d0 [8];
  string report;
  bool propInitialized;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *deps;
  iterator iStack_98;
  bool impliedByUse;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  byte local_61;
  undefined1 local_60 [7];
  bool explicitlySet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  bool propContent;
  bool *param_5_local;
  CompatibleType t_local;
  char *defaultValue_local;
  string *config_local;
  string *p_local;
  cmGeneratorTarget *tgt_local;
  
  headPropKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = getTypedProperty<bool>(tgt,p);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,tgt);
  local_78._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_60);
  local_70 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_78,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_80,p);
  iStack_98 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_60);
  local_61 = __gnu_cxx::operator!=(&local_70,&stack0xffffffffffffff68);
  bVar2 = cmGeneratorTarget::IsNullImpliedByLinkLibraries(tgt,p);
  local_76a = 1;
  if (bVar2 == (bool)(local_61 & 1)) {
    local_76b = 0;
    if (!bVar2) {
      local_76b = local_61 ^ 0xff;
    }
    local_76a = local_76b;
  }
  if ((local_76a & 1) == 0) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x10b6,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  this = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  bVar3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::empty
                    (this);
  if (bVar3) {
    report.field_2._12_4_ = 1;
    bVar1 = headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  }
  else {
    report.field_2._M_local_buf[0xb] = local_61 & 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_d0," * Target \"",&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    std::__cxx11::string::operator+=((string *)local_d0,(string *)psVar4);
    if ((local_61 & 1) == 0) {
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)local_d0,"\" property is implied by use.\n");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_d0,"\" property not set.\n");
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)local_d0,"\" has property content \"");
      valueAsString<bool>((string *)((long)&interfaceProperty.field_2 + 8),
                          (bool)(headPropKeys.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      std::__cxx11::string::operator+=
                ((string *)local_d0,(string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_d0,"\"\n");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&li,
                   "INTERFACE_",p);
    local_120._M_current =
         (cmGeneratorTarget **)
         std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::begin
                   (this);
    while( true ) {
      theTarget = (cmGeneratorTarget *)
                  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::end(this);
      bVar3 = __gnu_cxx::operator!=
                        (&local_120,
                         (__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                          *)&theTarget);
      if (!bVar3) break;
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&local_120);
      propKeys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar5;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_148,
                 (cmGeneratorTarget *)
                 propKeys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_160._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_148);
      local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_148);
      local_158 = std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                            (local_160,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_168,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &li);
      iStack_170 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_148);
      local_149 = __gnu_cxx::operator!=(&local_158,&stack0xfffffffffffffe90);
      reportEntry.field_2._M_local_buf[0xf] =
           getTypedProperty<bool>
                     ((cmGeneratorTarget *)
                      propKeys.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&li);
      std::__cxx11::string::string((string *)local_198);
      if ((local_149 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)local_198," * Target \"");
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((cmGeneratorTarget *)
                            propKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)local_198,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_198,"\" property value \"");
        valueAsString<bool>((string *)local_1b8,(bool)(reportEntry.field_2._M_local_buf[0xf] & 1));
        std::__cxx11::string::operator+=((string *)local_198,(string *)local_1b8);
        std::__cxx11::string::~string((string *)local_1b8);
        std::__cxx11::string::operator+=((string *)local_198,"\" ");
      }
      if ((local_61 & 1) == 0) {
        if (bVar2) {
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
               impliedValue<bool>((bool)(headPropKeys.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ &
                                        1));
          if ((local_149 & 1) == 0) {
            report.field_2._12_4_ = 4;
          }
          else {
            local_37a = consistentProperty<bool>
                                  ((bool)headPropKeys.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                   (bool)(reportEntry.field_2._M_local_buf[0xf] & 1),t);
            std::__cxx11::string::operator+=((string *)local_d0,(string *)local_198);
            compatibilityAgree_abi_cxx11_
                      (&local_3a0,t,
                       (headPropKeys.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) !=
                       (local_37a.second & 1U));
            std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_3a0);
            std::__cxx11::string::~string((string *)&local_3a0);
            if (((ushort)local_37a & 1) == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_518);
              poVar6 = std::operator<<((ostream *)local_518,"Property ");
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," on target \"");
              psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
              poVar6 = std::operator<<(poVar6,(string *)psVar4);
              poVar6 = std::operator<<(poVar6,"\" is\nimplied to be ");
              poVar6 = std::operator<<(poVar6,defaultValue);
              poVar6 = std::operator<<(poVar6,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," property on\ndependency \"");
              psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                                 ((cmGeneratorTarget *)
                                  propKeys.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              poVar6 = std::operator<<(poVar6,(string *)psVar4);
              std::operator<<(poVar6,"\" is in conflict.\n");
              std::__cxx11::ostringstream::str();
              pcVar7 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
              std::__cxx11::string::~string(local_538);
              report.field_2._12_4_ = 2;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_518);
            }
            else {
              headPropKeys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_37a.second & 1;
              report.field_2._12_4_ = 4;
            }
          }
        }
        else if ((local_149 & 1) == 0) {
          report.field_2._12_4_ = 4;
        }
        else if ((report.field_2._M_local_buf[0xb] & 1U) == 0) {
          std::operator+(&local_718,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198,"(Interface set)\n");
          std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_718);
          std::__cxx11::string::~string((string *)&local_718);
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
               reportEntry.field_2._M_local_buf[0xf] & 1;
          report.field_2._M_local_buf[0xb] = '\x01';
          report.field_2._12_4_ = 0;
        }
        else {
          local_53a = consistentProperty<bool>
                                ((bool)(headPropKeys.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1
                                       ),(bool)(reportEntry.field_2._M_local_buf[0xf] & 1),t);
          std::__cxx11::string::operator+=((string *)local_d0,(string *)local_198);
          compatibilityAgree_abi_cxx11_
                    (&local_560,t,
                     (headPropKeys.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) !=
                     (local_53a.second & 1U));
          std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_560);
          std::__cxx11::string::~string((string *)&local_560);
          if (((ushort)local_53a & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d8);
            poVar6 = std::operator<<((ostream *)local_6d8,"The INTERFACE_");
            poVar6 = std::operator<<(poVar6,(string *)p);
            poVar6 = std::operator<<(poVar6," property of \"");
            psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((cmGeneratorTarget *)
                                propKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar6 = std::operator<<(poVar6,(string *)psVar4);
            poVar6 = std::operator<<(poVar6,"\" does\nnot agree with the value of ");
            poVar6 = std::operator<<(poVar6,(string *)p);
            poVar6 = std::operator<<(poVar6," already determined\nfor \"");
            psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar6 = std::operator<<(poVar6,(string *)psVar4);
            std::operator<<(poVar6,"\".\n");
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
            std::__cxx11::string::~string(local_6f8);
            report.field_2._12_4_ = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d8);
          }
          else {
            headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_53a.second & 1;
            report.field_2._12_4_ = 4;
          }
        }
      }
      else if ((local_149 & 1) == 0) {
        report.field_2._12_4_ = 4;
      }
      else {
        local_1ba = consistentProperty<bool>
                              ((bool)(headPropKeys.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                               (bool)(reportEntry.field_2._M_local_buf[0xf] & 1),t);
        std::__cxx11::string::operator+=((string *)local_d0,(string *)local_198);
        compatibilityAgree_abi_cxx11_
                  (&local_1e0,t,
                   (headPropKeys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) !=
                   (local_1ba.second & 1U));
        std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        if (((ushort)local_1ba & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
          poVar6 = std::operator<<((ostream *)local_358,"Property ");
          poVar6 = std::operator<<(poVar6,(string *)p);
          poVar6 = std::operator<<(poVar6," on target \"");
          psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          poVar6 = std::operator<<(poVar6,(string *)psVar4);
          poVar6 = std::operator<<(poVar6,"\" does\nnot match the INTERFACE_");
          poVar6 = std::operator<<(poVar6,(string *)p);
          poVar6 = std::operator<<(poVar6," property requirement\nof dependency \"");
          psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                             ((cmGeneratorTarget *)
                              propKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar6 = std::operator<<(poVar6,(string *)psVar4);
          std::operator<<(poVar6,"\".\n");
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string(local_378);
          report.field_2._12_4_ = 2;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
        }
        else {
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_1ba.second & 1;
          report.field_2._12_4_ = 4;
        }
      }
      std::__cxx11::string::~string((string *)local_198);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
      if ((report.field_2._12_4_ != 0) && (report.field_2._12_4_ == 2)) break;
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&local_120);
    }
    valueAsString<bool>(&local_738,
                        (bool)(headPropKeys.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    compatibilityType_abi_cxx11_(&local_758,t);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,&local_738,(string *)local_d0,&local_758);
    std::__cxx11::string::~string((string *)&local_758);
    std::__cxx11::string::~string((string *)&local_738);
    bVar1 = headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
    report.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)&li);
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  return (bool)(bVar1 & 1);
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                          const std::string &p,
                                          const std::string& config,
                                          const char *defaultValue,
                                          CompatibleType t,
                                          PropertyType *)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
      std::find(headPropKeys.begin(), headPropKeys.end(),
                p) != headPropKeys.end();

  const bool impliedByUse =
          tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet)
      || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if(deps.empty())
    {
    return propContent;
    }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet)
    {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
    }
  else if (impliedByUse)
    {
    report += "\" property is implied by use.\n";
    }
  else
    {
    report += "\" property not set.\n";
    }

  std::string interfaceProperty = "INTERFACE_" + p;
  for(std::vector<cmGeneratorTarget const*>::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmGeneratorTarget const* theTarget = *li;

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet =
        std::find(propKeys.begin(), propKeys.end(),
                  interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent =
                    getTypedProperty<PropertyType>(theTarget,
                              interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet)
      {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
      }

    if (explicitlySet)
      {
      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" does\nnot match the "
            "INTERFACE_" << p << " property requirement\nof "
            "dependency \"" << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Explicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else if (impliedByUse)
      {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_" << p << " property on\ndependency \""
            << theTarget->GetName() << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Implicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else
      {
      if (ifaceIsSet)
        {
        if (propInitialized)
          {
          std::pair<bool, PropertyType> consistent =
                                    consistentProperty(propContent,
                                                       ifacePropContent, t);
          report += reportEntry;
          report += compatibilityAgree(t, propContent != consistent.second);
          if (!consistent.first)
            {
            std::ostringstream e;
            e << "The INTERFACE_" << p << " property of \""
              << theTarget->GetName() << "\" does\nnot agree with the value "
                "of " << p << " already determined\nfor \""
              << tgt->GetName() << "\".\n";
            cmSystemTools::Error(e.str().c_str());
            break;
            }
          else
            {
            propContent = consistent.second;
            continue;
            }
          }
        else
          {
          report += reportEntry + "(Interface set)\n";
          propContent = ifacePropContent;
          propInitialized = true;
          }
        }
      else
        {
        // Not set. Nothing to agree on.
        continue;
        }
      }
    }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}